

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cap.cc
# Opt level: O3

S2Cap * __thiscall S2Cap::Expanded(S2Cap *__return_storage_ptr__,S2Cap *this,S1Angle distance)

{
  VType VVar1;
  bool bVar2;
  S1ChordAngle SVar3;
  S1ChordAngle local_30;
  S2LogMessage local_28;
  
  if (distance.radians_ < 0.0) {
    S2LogMessage::S2LogMessage
              (&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cap.cc"
               ,0x6d,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_28.stream_,"Check failed: (distance.radians()) >= (0) ",0x2a);
LAB_001d3fe3:
    abort();
  }
  SVar3.length2_ = (this->radius_).length2_;
  if (0.0 <= SVar3.length2_) {
    S1ChordAngle::S1ChordAngle(&local_30,distance);
    SVar3 = operator+(SVar3,local_30);
    (__return_storage_ptr__->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2Region_002bb758;
    VVar1 = (this->center_).c_[1];
    (__return_storage_ptr__->center_).c_[0] = (this->center_).c_[0];
    (__return_storage_ptr__->center_).c_[1] = VVar1;
    (__return_storage_ptr__->center_).c_[2] = (this->center_).c_[2];
    (__return_storage_ptr__->radius_).length2_ = SVar3.length2_;
    bVar2 = S2::IsUnitLength(&__return_storage_ptr__->center_);
    if ((!bVar2) || (4.0 < (__return_storage_ptr__->radius_).length2_)) {
      S2LogMessage::S2LogMessage
                (&local_28,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cap.h"
                 ,0xf5,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_28.stream_,"Check failed: is_valid() ",0x19);
      goto LAB_001d3fe3;
    }
  }
  else {
    (__return_storage_ptr__->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2Region_002bb758;
    (__return_storage_ptr__->center_).c_[0] = 1.0;
    (__return_storage_ptr__->center_).c_[1] = 0.0;
    (__return_storage_ptr__->center_).c_[2] = 0.0;
    S1ChordAngle::S1ChordAngle(&__return_storage_ptr__->radius_,-1.0);
  }
  return __return_storage_ptr__;
}

Assistant:

S2Cap S2Cap::Expanded(S1Angle distance) const {
  S2_DCHECK_GE(distance.radians(), 0);
  if (is_empty()) return Empty();
  return S2Cap(center_, radius_ + S1ChordAngle(distance));
}